

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

void move_to_back(saucy *s,coloring *c,int k)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = c->cfront[k];
  iVar2 = c->clen[iVar1];
  iVar3 = s->conncnts[iVar1];
  s->conncnts[iVar1] = iVar3 + 1;
  swap_labels(c,(iVar2 + iVar1) - iVar3,c->unlab[k]);
  if (iVar3 == 0) {
    iVar2 = s->csize;
    s->csize = iVar2 + 1;
    s->clist[iVar2] = iVar1;
  }
  return;
}

Assistant:

static void
move_to_back(struct saucy *s, struct coloring *c, int k)
{
    int cf = c->cfront[k];
    int cb = cf + c->clen[cf];
    int offset = s->conncnts[cf]++;

    /* Move this connected label to the back of its cell */
    swap_labels(c, cb - offset, c->unlab[k]);

    /* Add it to the cell list if it's the first one swapped */
    if (!offset) s->clist[s->csize++] = cf;
}